

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::emit_complex_bitcast
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t op0)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  bool forwarding;
  SPIRType *pSVar4;
  SPIRType *pSVar5;
  char (*in_R8) [3];
  bool bVar6;
  string expr;
  string local_90;
  string local_70;
  string local_50;
  
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  pSVar5 = Compiler::expression_type(&this->super_Compiler,op0);
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar2 = *(int *)&(pSVar4->super_IVariant).field_0xc;
  iVar3 = *(int *)&(pSVar5->super_IVariant).field_0xc;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (pSVar5->vecsize == 1 && (iVar3 == 0xd && iVar2 == 0xc)) {
    to_unpacked_expression_abi_cxx11_(&local_90,this,op0,true);
    join<char_const(&)[33],std::__cxx11::string,char_const(&)[3]>
              (&local_70,(spirv_cross *)"unpackFloat2x16(floatBitsToUint(",(char (*) [33])&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f3a23,in_R8);
  }
  else {
    if (pSVar5->vecsize != 2 || (iVar3 != 0xc || iVar2 != 0xd)) {
      bVar6 = false;
      goto LAB_001c6dcd;
    }
    to_unpacked_expression_abi_cxx11_(&local_90,this,op0,true);
    join<char_const(&)[31],std::__cxx11::string,char_const(&)[3]>
              (&local_70,(spirv_cross *)"uintBitsToFloat(packFloat2x16(",(char (*) [31])&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f3a23,in_R8);
  }
  ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  forwarding = should_forward(this,op0);
  bVar6 = true;
  emit_op(this,result_type,id,&local_50,forwarding,false);
LAB_001c6dcd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar6;
}

Assistant:

bool CompilerGLSL::emit_complex_bitcast(uint32_t result_type, uint32_t id, uint32_t op0)
{
	// Some bitcasts may require complex casting sequences, and are implemented here.
	// Otherwise a simply unary function will do with bitcast_glsl_op.

	auto &output_type = get<SPIRType>(result_type);
	auto &input_type = expression_type(op0);
	string expr;

	if (output_type.basetype == SPIRType::Half && input_type.basetype == SPIRType::Float && input_type.vecsize == 1)
		expr = join("unpackFloat2x16(floatBitsToUint(", to_unpacked_expression(op0), "))");
	else if (output_type.basetype == SPIRType::Float && input_type.basetype == SPIRType::Half &&
	         input_type.vecsize == 2)
		expr = join("uintBitsToFloat(packFloat2x16(", to_unpacked_expression(op0), "))");
	else
		return false;

	emit_op(result_type, id, expr, should_forward(op0));
	return true;
}